

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::replaceKey(QPDFObjectHandle *this,string *key,QPDFObjectHandle *value)

{
  bool bVar1;
  allocator<char> local_79;
  string local_78;
  uint local_54;
  QPDFObjectHandle local_50 [2];
  undefined1 local_30 [8];
  Dictionary dict;
  QPDFObjectHandle *value_local;
  string *key_local;
  QPDFObjectHandle *this_local;
  
  dict.super_BaseDictionary.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  as_dictionary((QPDFObjectHandle *)local_30,(typed)this);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_30);
  if (bVar1) {
    checkOwnership(this,(QPDFObjectHandle *)
                        dict.super_BaseDictionary.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
    QPDFObjectHandle(local_50,(QPDFObjectHandle *)
                              dict.super_BaseDictionary.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi);
    ::qpdf::BaseDictionary::replaceKey((BaseDictionary *)local_30,key,local_50);
    ~QPDFObjectHandle(local_50);
  }
  local_54 = (uint)bVar1;
  ::qpdf::Dictionary::~Dictionary((Dictionary *)local_30);
  if (local_54 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"ignoring key replacement request",&local_79);
    typeWarning(this,"dictionary",&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    QTC::TC("qpdf","QPDFObjectHandle dictionary ignoring replaceKey",0);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::replaceKey(std::string const& key, QPDFObjectHandle const& value)
{
    if (auto dict = as_dictionary(strict)) {
        checkOwnership(value);
        dict.replaceKey(key, value);
        return;
    }
    typeWarning("dictionary", "ignoring key replacement request");
    QTC::TC("qpdf", "QPDFObjectHandle dictionary ignoring replaceKey");
}